

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<long_double,long>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,longdouble *t_lhs,longdouble *c_lhs,
          long *c_rhs)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  longdouble lVar3;
  longdouble lVar4;
  Boxed_Value BVar5;
  
  switch(t_oper) {
  case equals:
    b = (longdouble)*c_rhs == *c_lhs;
    break;
  case less_than:
    lVar3 = *c_lhs;
    lVar4 = (longdouble)*c_rhs;
    goto LAB_0031d6b4;
  case greater_than:
    lVar4 = *c_lhs;
    lVar3 = (longdouble)*c_rhs;
LAB_0031d6b4:
    b = lVar3 < lVar4;
    break;
  case less_than_equal:
    lVar3 = *c_lhs;
    lVar4 = (longdouble)*c_rhs;
    goto LAB_0031d67e;
  case greater_than_equal:
    lVar4 = *c_lhs;
    lVar3 = (longdouble)*c_rhs;
LAB_0031d67e:
    b = lVar3 <= lVar4;
    break;
  case not_equal:
    b = (longdouble)*c_rhs != *c_lhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      break;
    case quotient:
      check_divide_by_zero<long>(*c_rhs);
      break;
    case product:
      break;
    case difference:
      break;
    default:
      if (t_lhs == (longdouble *)0x0) {
switchD_0031d629_caseD_7:
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar1 = &PTR__bad_cast_003bf5e0;
        __cxa_throw(puVar1,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      switch(t_oper) {
      case assign:
        lVar4 = (longdouble)*c_rhs;
        break;
      default:
        goto switchD_0031d629_caseD_7;
      case assign_product:
        lVar4 = *t_lhs * (longdouble)*c_rhs;
        break;
      case assign_sum:
        lVar4 = *t_lhs + (longdouble)*c_rhs;
        break;
      case assign_quotient:
        check_divide_by_zero<long>(*c_rhs);
        lVar4 = *t_lhs / (longdouble)*c_rhs;
        break;
      case assign_difference:
        lVar4 = *t_lhs - (longdouble)*c_rhs;
      }
      *t_lhs = lVar4;
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_bv);
      _Var2._M_pi = extraout_RDX;
      goto LAB_0031d70f;
    }
    BVar5 = detail::const_var_impl<long_double>((longdouble *)this);
    _Var2._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_0031d70f;
  }
  BVar5 = const_var((chaiscript *)this,b);
  _Var2._M_pi = BVar5.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_0031d70f:
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }